

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O0

void __thiscall
cmConfigureLog::WriteLiteralTextBlock(cmConfigureLog *this,string_view key,string_view text)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  ofstream *__os;
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  byte *pbVar2;
  const_reference pvVar3;
  const_pointer pvVar4;
  char *first;
  char *__last;
  ulong uVar5;
  difference_type k;
  char *n;
  value_type *e;
  value_type *s;
  uint c32;
  uchar c;
  size_type i;
  size_type l;
  char *local_38;
  cmConfigureLog *local_30;
  cmConfigureLog *this_local;
  string_view text_local;
  string_view key_local;
  
  text_local._M_len = (size_t)text._M_str;
  this_local = (cmConfigureLog *)text._M_len;
  text_local._M_str = (char *)key._M_len;
  local_30 = this;
  __os = BeginLine(this);
  l = (size_type)text_local._M_str;
  __str._M_str = key._M_str;
  __str._M_len = (size_t)text_local._M_str;
  local_38 = key._M_str;
  pbVar1 = std::operator<<(&__os->super_basic_ostream<char,_std::char_traits<char>_>,__str);
  std::operator<<(pbVar1,": |");
  EndLine(this);
  i = std::basic_string_view<char,_std::char_traits<char>_>::length
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (i != 0) {
    this->Indent = this->Indent + 1;
    BeginLine(this);
    _c32 = 0;
LAB_007e1fdc:
    if (_c32 < i) {
      pbVar2 = (byte *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                                  _c32);
      s._7_1_ = *pbVar2;
      if (s._7_1_ == 9) {
        std::ostream::put((char)this + '8');
        _c32 = _c32 + 1;
      }
      else if (s._7_1_ == 10) {
        if (_c32 + 1 < i) {
          EndLine(this);
          BeginLine(this);
        }
        _c32 = _c32 + 1;
      }
      else if (s._7_1_ == 0xd) {
        _c32 = _c32 + 1;
        if ((_c32 == i) ||
           (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,_c32
                               ), *pvVar3 != '\n')) {
          WriteEscape(this,s._7_1_);
        }
      }
      else {
        if (s._7_1_ != 0x5c) {
          if ((0x1f < s._7_1_) && (s._7_1_ < 0x7f)) {
            std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,_c32);
            std::ostream::put((char)this + '8');
            _c32 = _c32 + 1;
            goto LAB_007e1fdc;
          }
          if (0x7f < s._7_1_) {
            pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                               ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
            first = pvVar4 + _c32;
            pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                               ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
            __last = cm_utf8_decode_character(first,pvVar4 + i,(uint *)&s);
            if ((first < __last) && (0x9f < (uint)s)) {
              uVar5 = std::distance<char_const*>(first,__last);
              std::ostream::write((char *)&this->Stream,(long)first);
              _c32 = (uVar5 & 0xffffffff) + _c32;
              goto LAB_007e1fdc;
            }
          }
          WriteEscape(this,s._7_1_);
          _c32 = _c32 + 1;
          goto LAB_007e1fdc;
        }
        std::operator<<(&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>,"\\\\");
        _c32 = _c32 + 1;
      }
      goto LAB_007e1fdc;
    }
    EndLine(this);
    this->Indent = this->Indent - 1;
  }
  return;
}

Assistant:

void cmConfigureLog::WriteLiteralTextBlock(cm::string_view key,
                                           cm::string_view text)
{
  this->BeginLine() << key << ": |";
  this->EndLine();

  auto const l = text.length();
  if (l) {
    ++this->Indent;
    this->BeginLine();

    auto i = decltype(l){ 0 };
    while (i < l) {
      // YAML allows ' ', '\t' and "printable characters", but NOT other
      // ASCII whitespace; those must be escaped, as must the upper UNICODE
      // control characters (U+0080 - U+009F)
      static constexpr unsigned int C1_LAST = 0x9F;
      auto const c = static_cast<unsigned char>(text[i]);
      switch (c) {
        case '\r':
          // Print a carriage return only if it is not followed by a line feed.
          ++i;
          if (i == l || text[i] != '\n') {
            this->WriteEscape(c);
          }
          break;
        case '\n':
          // Print any line feeds except the very last one
          if (i + 1 < l) {
            this->EndLine();
            this->BeginLine();
          }
          ++i;
          break;
        case '\t':
          // Print horizontal tab verbatim
          this->Stream.put('\t');
          ++i;
          break;
        case '\\':
          // Escape backslash for disambiguation
          this->Stream << "\\\\";
          ++i;
          break;
        default:
          if (c >= 32 && c < 127) {
            // Print ascii byte.
            this->Stream.put(text[i]);
            ++i;
            break;
          } else if (c > 127) {
            // Decode a UTF-8 sequence.
            unsigned int c32;
            auto const* const s = text.data() + i;
            auto const* const e = text.data() + l;
            auto const* const n = cm_utf8_decode_character(s, e, &c32);
            if (n > s && c32 > C1_LAST) {
              auto const k = std::distance(s, n);
              this->Stream.write(s, static_cast<std::streamsize>(k));
              i += static_cast<unsigned>(k);
              break;
            }
          }

          // Escape non-printable byte.
          this->WriteEscape(c);
          ++i;
          break;
      }
    }

    this->EndLine();
    --this->Indent;
  }
}